

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O0

RootNode * __thiscall Fl_Preferences::Node::findRoot(Node *this)

{
  Node *local_20;
  Node *n;
  Node *this_local;
  
  local_20 = this;
  do {
    if (((byte)local_20->field_0x30 >> 1 & 1) != 0) {
      return (RootNode *)(local_20->field_2).parent_;
    }
    local_20 = parent(local_20);
  } while (local_20 != (Node *)0x0);
  return (RootNode *)0x0;
}

Assistant:

Fl_Preferences::RootNode *Fl_Preferences::Node::findRoot() {
  Node *n = this;
  do {
    if (n->top_)
      return n->root_;
    n = n->parent();
  } while (n);
  return 0L;
}